

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::DragBehaviorT<double,double,double>
               (ImGuiDataType data_type,double *v,float v_speed,double v_min,double v_max,
               char *format,ImGuiSliderFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  byte bVar6;
  uint uVar7;
  float fVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 in_register_00001204 [60];
  undefined1 extraout_var_00 [56];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar11 [16];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  float local_78;
  undefined8 local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  pIVar1 = GImGui;
  auVar20._4_60_ = in_register_00001204;
  auVar20._0_4_ = v_speed;
  auVar20 = ZEXT1664(auVar20._0_16_);
  uVar3 = data_type & 0xfffffffe;
  if ((((v_speed == 0.0) && (!NAN(v_speed))) && (v_min < v_max)) &&
     (v_max - v_min < 3.4028234663852886e+38)) {
    dVar9 = (v_max - v_min) * (double)GImGui->DragSpeedDefaultRatio;
    auVar20 = ZEXT864(CONCAT44((int)((ulong)dVar9 >> 0x20),(float)dVar9));
  }
  uVar7 = (flags & 0x100000U) >> 0x14;
  auVar11 = auVar20._0_16_;
  auVar21 = auVar20;
  if (GImGui->ActiveIdSource == ImGuiInputSource_Mouse) {
    bVar2 = IsMousePosValid((ImVec2 *)0x0);
    auVar21 = ZEXT1664(auVar11);
    if (!bVar2) goto LAB_00181469;
    bVar2 = IsMouseDragPastThreshold(0,(pIVar1->IO).MouseDragThreshold * 0.5);
    auVar21 = ZEXT1664(auVar11);
    fVar8 = auVar20._0_4_;
    if (!bVar2) goto LAB_00181469;
    fVar19 = (pIVar1->IO).NavInputs[(ulong)uVar7 + 0x1d];
    if ((pIVar1->IO).KeyAlt != false) {
      fVar19 = fVar19 * 0.01;
    }
    if ((pIVar1->IO).KeyShift != false) {
      fVar19 = fVar19 * 10.0;
    }
  }
  else {
LAB_00181469:
    fVar8 = auVar21._0_4_;
    fVar19 = 0.0;
    if (pIVar1->ActiveIdSource == ImGuiInputSource_Nav) {
      uVar4 = 0;
      if (uVar3 == 8) {
        uVar4 = ImParseFormatPrecision(format,3);
      }
      auVar21._0_8_ = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      auVar21._8_56_ = extraout_var_00;
      local_38 = vmovlps_avx(auVar21._0_16_);
      fVar19 = *(float *)((long)&local_38 + (ulong)uVar7 * 4);
      if ((int)uVar4 < 0) {
        auVar13 = SUB6416(ZEXT464(0x800000),0);
      }
      else if ((int)uVar4 < 10) {
        auVar13 = ZEXT416(*(uint *)(GetMinimumStepAtDecimalPrecision(int)::min_steps +
                                   (ulong)uVar4 * 4));
      }
      else {
        auVar14._0_4_ = powf(10.0,(float)(int)-uVar4);
        auVar14._4_60_ = extraout_var;
        auVar13 = auVar14._0_16_;
      }
      auVar12 = vcmpss_avx(auVar13,auVar11,2);
      auVar11 = vblendvps_avx(auVar13,auVar11,auVar12);
      fVar8 = auVar11._0_4_;
    }
  }
  bVar6 = uVar3 == 8 & (byte)((flags & 0x20U) >> 5);
  fVar19 = fVar19 * fVar8;
  if ((flags & 0x100000U) != 0) {
    fVar19 = -fVar19;
  }
  if (((bVar6 != 0) && (dVar9 = v_max - v_min, dVar9 < 3.4028234663852886e+38)) &&
     (9.999999974752427e-07 < dVar9)) {
    fVar19 = fVar19 / (float)dVar9;
  }
  if (v_min < v_max) {
    if ((*v < v_max) || (bVar2 = true, fVar19 <= 0.0)) {
      bVar2 = fVar19 < 0.0 && *v <= v_min;
    }
  }
  else {
    bVar2 = false;
  }
  if ((pIVar1->ActiveIdIsJustActivated != false) || (bVar2)) {
    pIVar1->DragCurrentAccum = 0.0;
    bVar2 = false;
  }
  else {
    if ((fVar19 == 0.0) && (!NAN(fVar19))) goto LAB_001815ee;
    pIVar1->DragCurrentAccum = fVar19 + pIVar1->DragCurrentAccum;
    bVar2 = true;
  }
  pIVar1->DragCurrentAccumDirty = bVar2;
LAB_001815ee:
  if (pIVar1->DragCurrentAccumDirty == true) {
    dVar9 = *v;
    if (bVar6 == 0) {
      auVar11._8_8_ = 0;
      auVar11._0_8_ = dVar9 + (double)pIVar1->DragCurrentAccum;
      local_78 = 0.0;
      dVar9 = 0.0;
    }
    else {
      iVar5 = ImParseFormatPrecision(format,3);
      local_78 = powf(0.1,(float)iVar5);
      fVar8 = ScaleRatioFromValueT<double,double,double>
                        (data_type,dVar9,v_min,v_max,true,local_78,0.0);
      auVar15._0_8_ =
           ScaleValueFromRatioT<double,double,double>
                     (data_type,fVar8 + pIVar1->DragCurrentAccum,v_min,v_max,true,local_78,0.0);
      auVar15._8_56_ = extraout_var_01;
      auVar11 = auVar15._0_16_;
      dVar9 = (double)fVar8;
    }
    if ((flags & 0x40U) == 0) {
      auVar16._0_8_ = RoundScalarWithFormatT<double,double>(format,data_type,auVar11._0_8_);
      auVar16._8_56_ = extraout_var_02;
      auVar11 = auVar16._0_16_;
    }
    pIVar1->DragCurrentAccumDirty = false;
    if (bVar6 == 0) {
      dVar9 = auVar11._0_8_ - *v;
    }
    else {
      fVar8 = ScaleRatioFromValueT<double,double,double>
                        (data_type,auVar11._0_8_,v_min,v_max,true,local_78,0.0);
      dVar9 = (double)fVar8 - dVar9;
    }
    auVar18._8_8_ = 0;
    auVar18._0_8_ = v_max;
    pIVar1->DragCurrentAccum = pIVar1->DragCurrentAccum - (float)dVar9;
    auVar12._0_12_ = ZEXT812(0);
    auVar12._12_4_ = 0;
    auVar13 = vcmpsd_avx(auVar11,auVar12,0);
    auVar13 = vandnpd_avx(auVar13,auVar11);
    dVar9 = *v;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar9;
    if (v_min < v_max) {
      dVar10 = auVar13._0_8_;
      if ((dVar9 != dVar10) || (NAN(dVar9) || NAN(dVar10))) {
        if ((dVar10 < v_min) || (((uVar3 != 8 && (dVar9 < dVar10)) && (fVar19 < 0.0)))) {
          auVar13._8_8_ = 0;
          auVar13._0_8_ = v_min;
        }
        if ((v_max < auVar13._0_8_) || (((uVar3 != 8 && (auVar13._0_8_ < dVar9)) && (0.0 < fVar19)))
           ) {
          auVar13 = auVar18;
        }
      }
    }
    dVar10 = auVar13._0_8_;
    if ((dVar9 != dVar10) || (NAN(dVar9) || NAN(dVar10))) {
      *v = dVar10;
      bVar2 = true;
    }
    else {
      auVar11 = vcmpsd_avx(auVar17,auVar13,4);
      bVar2 = (bool)(auVar11[0] & 1);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) && is_decimal;

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}